

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,ExportStatement *stmt)

{
  size_type sVar1;
  pointer pcVar2;
  element_type *peVar3;
  TableCatalogEntry *table;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar4;
  pointer pCVar5;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var8;
  bool bVar9;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> _Var10;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var11;
  undefined1 auVar12 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> uVar15;
  char cVar16;
  char cVar17;
  pointer pCVar18;
  CopyInfo *this_00;
  pointer pCVar19;
  long *plVar20;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar21;
  pointer pCVar22;
  NotNullConstraint *pNVar23;
  ColumnDefinition *pCVar24;
  ColumnList *pCVar25;
  string *__a;
  LogicalType *__b;
  pointer pBVar26;
  BaseTableRef *this_01;
  pointer pBVar27;
  SelectNode *this_02;
  pointer pSVar28;
  Binder *this_03;
  pointer prVar29;
  pointer pLVar30;
  StatementProperties *pSVar31;
  NotImplementedException *this_04;
  ulong uVar32;
  catalog_entry_vector_t *pcVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  pointer *__ptr;
  ulong uVar35;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_05;
  ClientContext *pCVar36;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar37;
  ColumnListIterator CVar38;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ExportedTableData exported_data;
  shared_ptr<duckdb::Binder,_true> copy_binder;
  ExportedTableInfo table_info;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  export_nodes;
  catalog_entry_vector_t tables;
  string catalog;
  child_list_t<LogicalType> select_list;
  string full_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  not_null_columns;
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> entry;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table_name_index;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_488;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_480;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_478;
  optional_ptr<duckdb::Binder,_true> local_470;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_468;
  BoundStatement *local_460;
  undefined1 local_458 [8];
  vector<duckdb::DummyBinding,_true> *pvStack_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  pointer local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  element_type *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  pointer local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  SQLStatement *local_3d8;
  pointer pbStack_3d0;
  pointer local_3c8;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> local_3c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_398;
  __node_base local_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  LogicalType local_368;
  element_type local_350;
  _Hash_node_base local_310 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300 [24];
  undefined1 local_2e8 [8];
  pointer puStack_2e0;
  pointer local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  catalog_entry_vector_t local_2c8;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_280;
  __node_base local_278;
  undefined1 local_268 [8];
  pointer pLStack_260;
  undefined1 local_258 [48];
  undefined1 local_228 [32];
  optional_ptr<duckdb::BoundParameterMap,_true> local_208;
  _Alloc_hider local_200;
  pointer local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined1 local_1e0 [128];
  optional_ptr<duckdb::SQLStatement,_true> local_160;
  pointer pbStack_158;
  pointer local_150;
  undefined1 local_148 [8];
  __node_base _Stack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [6];
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> local_d0 [2];
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_c0;
  _Any_data local_a8;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  float local_48;
  size_type local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_470.ptr = this;
  local_460 = __return_storage_ptr__;
  LogicalType::LogicalType((LogicalType *)local_148,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_458,__l,
             (allocator_type *)local_68);
  (local_460->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_458;
  (local_460->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pvStack_450;
  (local_460->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_448._M_allocated_capacity;
  local_378._0_8_ = (pointer)0x0;
  local_388._0_8_ = (pointer)0x0;
  local_388._8_8_ = (pointer)0x0;
  local_458 = (undefined1  [8])0x0;
  pvStack_450 = (vector<duckdb::DummyBinding,_true> *)0x0;
  local_448._M_allocated_capacity = 0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_388);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_458);
  LogicalType::~LogicalType((LogicalType *)local_148);
  local_388._0_8_ = local_388 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Success","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_388;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148,__l_00,(allocator_type *)local_68);
  (local_460->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148;
  (local_460->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_140._M_nxt;
  (local_460->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138[0]._0_8_;
  local_448._M_allocated_capacity = 0;
  local_458 = (undefined1  [8])0x0;
  pvStack_450 = (vector<duckdb::DummyBinding,_true> *)0x0;
  local_148 = (undefined1  [8])0x0;
  _Stack_140._M_nxt = (_Hash_node_base *)0x0;
  local_138[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_458);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_);
  }
  pCVar36 = (local_470.ptr)->context;
  local_388._0_8_ = local_388 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_388,anon_var_dwarf_6372561 + 9);
  local_458 = (undefined1  [8])&local_448;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"main","");
  local_478 = &stmt->info;
  pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_478);
  local_148 = (undefined1  [8])
              Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                        (pCVar36,(string *)local_388,(string *)local_458,&pCVar18->format,
                         THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)local_148);
  auVar12 = local_148;
  if (local_458 != (undefined1  [8])&local_448) {
    operator_delete((void *)local_458);
  }
  if ((catalog_entry_vector_t *)local_388._0_8_ != (catalog_entry_vector_t *)(local_388 + 0x10)) {
    operator_delete((void *)local_388._0_8_);
  }
  if (*(copy_to_plan_t *)((long)auVar12 + 0x168) == (copy_to_plan_t)0x0 &&
      *(copy_to_bind_t *)((long)auVar12 + 0x178) == (copy_to_bind_t)0x0) {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_388._0_8_ = local_388 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_388,"COPY TO is not supported for FORMAT \"%s\"","");
    pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_478);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar2 = (pCVar18->format)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (pCVar18->format)._M_string_length);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_04,(string *)local_388,&local_88);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  sVar1 = (stmt->database)._M_string_length;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  if (sVar1 == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,anon_var_dwarf_6372561 + 9);
  }
  else {
    pcVar2 = (stmt->database)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_2a8,pcVar2,pcVar2 + sVar1);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auVar12;
  local_2c8.
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Catalog::GetSchemas(&local_c0,(local_470.ptr)->context,&local_2a8);
  if (local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar36 = (ClientContext *)
              local_c0.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar3 = (pCVar36->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal
               .super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_388._8_8_ = (pointer)0x0;
      local_378._8_8_ =
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_invoke;
      local_378._0_8_ =
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_manager;
      local_388._0_8_ = &local_2c8;
      (*(((InCatalogEntry *)&peVar3->super_enable_shared_from_this<duckdb::ClientContext>)->
        super_CatalogEntry)._vptr_CatalogEntry[0x10])(peVar3,(local_470.ptr)->context,1,local_388);
      if ((pointer)local_378._0_8_ != (pointer)0x0) {
        (*(code *)local_378._0_8_)(local_388,local_388,3);
      }
      pCVar36 = (ClientContext *)
                &(pCVar36->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                 internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    } while (pCVar36 !=
             (ClientContext *)
             local_c0.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ReorderTableEntries(&local_2c8);
  paVar34 = local_2d0;
  local_390._M_nxt = (_Hash_node_base *)FileSystem::GetFileSystem((local_470.ptr)->context);
  local_3c0._M_head_impl = (BoundExportData *)operator_new(0x28);
  ((local_3c0._M_head_impl)->super_ParseInfo).info_type = BOUND_EXPORT_DATA;
  ((local_3c0._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__BoundExportData_024465d0;
  ((local_3c0._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_3c0._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_3c0._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = &DAT_00000001;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = (_Hash_node_base *)0x0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_2d8 = (pointer)0x0;
  local_2e8 = (undefined1  [8])0x0;
  puStack_2e0 = (pointer)0x0;
  local_1f8 = local_2c8.
              super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = (pointer)0x0;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0.0;
  local_a8._12_4_ = 0;
  if (local_2c8.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1f0._8_8_ = paVar34->_M_local_buf + 0x3b0;
    local_398 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3d8;
    local_200._M_p = (pointer)&local_160;
    local_208.ptr = (BoundParameterMap *)&PTR__CopyStatement_02450eb8;
    prVar29 = local_2c8.
              super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      table = (TableCatalogEntry *)prVar29->_M_data;
      local_1f0._M_allocated_capacity = (size_type)prVar29;
      this_00 = (CopyInfo *)operator_new(0x110);
      CopyInfo::CopyInfo(this_00);
      local_488._M_head_impl = this_00;
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_478);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      ::std::__cxx11::string::_M_assign((string *)&pCVar18->format);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(local_478);
      pCVar19 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      if (pCVar18 != pCVar19) {
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pCVar19->options,&(pCVar18->options)._M_h);
      }
      uVar35 = 0;
      do {
        if (uVar35 == 0) {
          local_388._0_8_ = local_388 + 0x10;
          local_388._8_8_ = (pointer)0x0;
          local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
        }
        else {
          cVar17 = '\x01';
          if (9 < uVar35) {
            uVar32 = uVar35;
            cVar16 = '\x04';
            do {
              cVar17 = cVar16;
              if (uVar32 < 100) {
                cVar17 = cVar17 + -2;
                goto LAB_011c57e9;
              }
              if (uVar32 < 1000) {
                cVar17 = cVar17 + -1;
                goto LAB_011c57e9;
              }
              if (uVar32 < 10000) goto LAB_011c57e9;
              bVar9 = 99999 < uVar32;
              uVar32 = uVar32 / 10000;
              cVar16 = cVar17 + '\x04';
            } while (bVar9);
            cVar17 = cVar17 + '\x01';
          }
LAB_011c57e9:
          local_458 = (undefined1  [8])&local_448;
          ::std::__cxx11::string::_M_construct((ulong)local_458,cVar17);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_458,(uint)pvStack_450,uVar35);
          plVar20 = (long *)::std::__cxx11::string::replace
                                      ((ulong)local_458,0,(char *)0x0,0x1e09fa0);
          local_388._0_8_ = local_388 + 0x10;
          pcVar33 = (catalog_entry_vector_t *)(plVar20 + 2);
          if ((catalog_entry_vector_t *)*plVar20 == pcVar33) {
            local_378._0_8_ =
                 (pcVar33->
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_378._8_8_ = plVar20[3];
          }
          else {
            local_378._0_8_ =
                 (pcVar33->
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_388._0_8_ = (catalog_entry_vector_t *)*plVar20;
          }
          local_388._8_8_ = plVar20[1];
          *plVar20 = (long)pcVar33;
          plVar20[1] = 0;
          *(undefined1 *)(plVar20 + 2) = 0;
          if (local_458 != (undefined1  [8])&local_448) {
            operator_delete((void *)local_458);
          }
        }
        CreateFileName((string *)local_458,(string *)local_388,table,(string *)local_1f0._8_8_);
        pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->(local_478);
        local_148 = (undefined1  [8])local_138;
        pcVar2 = (pCVar18->file_path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,pcVar2,pcVar2 + (pCVar18->file_path)._M_string_length);
        FileSystem::JoinPath
                  ((string *)local_268,(FileSystem *)local_390._M_nxt,(string *)local_148,
                   (string *)local_458);
        pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_488);
        ::std::__cxx11::string::_M_assign((string *)&pCVar18->file_path);
        pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_488);
        local_3b8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
        pVar37 = ::std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_3b8.
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,&pCVar18->file_path,
                            &local_3b8);
        if (local_268 != (undefined1  [8])local_258) {
          operator_delete((void *)local_268);
        }
        if (local_148 != (undefined1  [8])local_138) {
          operator_delete((void *)local_148);
        }
        if (local_458 != (undefined1  [8])&local_448) {
          operator_delete((void *)local_458);
        }
        if ((catalog_entry_vector_t *)local_388._0_8_ !=
            (catalog_entry_vector_t *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_);
        }
        uVar35 = uVar35 + 1;
      } while (((undefined1  [16])pVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      pCVar18->is_from = false;
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      ::std::__cxx11::string::_M_assign((string *)&pCVar18->catalog);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      ::std::__cxx11::string::_M_assign((string *)&pCVar18->schema);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_488);
      ::std::__cxx11::string::_M_assign((string *)&pCVar18->table);
      local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pbStack_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_278._M_nxt = (_Hash_node_base *)0x0;
      local_228._16_8_ = (pointer)0x0;
      local_228._0_8_ = (pointer)0x0;
      local_228._8_8_ = (pointer)0x0;
      pvVar21 = TableCatalogEntry::GetConstraints(table);
      puVar4 = (pvVar21->
               super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_05 = (pvVar21->
                     super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar4;
          this_05 = this_05 + 1) {
        pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_05);
        if (pCVar22->type == NOT_NULL) {
          pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_05);
          pNVar23 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar22);
          pCVar24 = TableCatalogEntry::GetColumn(table,(LogicalIndex)(pNVar23->index).index);
          ColumnDefinition::GetName_abi_cxx11_((string *)local_388,pCVar24);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_228,
                     (string *)local_388);
          if ((catalog_entry_vector_t *)local_388._0_8_ !=
              (catalog_entry_vector_t *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_);
          }
        }
      }
      pCVar25 = TableCatalogEntry::GetColumns(table);
      CVar38 = ColumnList::Physical(pCVar25);
      pCVar25 = CVar38.list;
      if (((undefined1  [16])CVar38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pCVar5 = (pCVar25->columns).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_448._8_8_ =
             ((long)pCVar5 -
              (long)(pCVar25->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
        uVar35 = ((long)pCVar5 -
                  (long)(pCVar25->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        uVar35 = (long)(pCVar25->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar25->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        local_448._8_8_ = uVar35;
      }
      local_448._M_allocated_capacity = 0;
      pvStack_450 = (vector<duckdb::DummyBinding,_true> *)
                    CONCAT71(pvStack_450._1_7_,CVar38.physical);
      local_458 = (undefined1  [8])pCVar25;
      while (((pvVar13 = local_398, local_448._M_allocated_capacity != uVar35 ||
              (local_448._8_8_ != uVar35)) || (local_458 != (undefined1  [8])pCVar25))) {
        pCVar24 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_458);
        __a = ColumnDefinition::Name_abi_cxx11_(pCVar24);
        __b = ColumnDefinition::Type(pCVar24);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_388,__a,__b);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_288,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_388);
        LogicalType::~LogicalType(&local_368);
        if ((catalog_entry_vector_t *)local_388._0_8_ !=
            (catalog_entry_vector_t *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_);
        }
        local_448._M_allocated_capacity = local_448._M_allocated_capacity + 1;
      }
      local_458 = (undefined1  [8])&local_448;
      pvStack_450 = (vector<duckdb::DummyBinding,_true> *)0x0;
      local_448._M_allocated_capacity = local_448._M_allocated_capacity & 0xffffffffffffff00;
      local_438 = &local_428;
      local_430 = (pointer)0x0;
      local_428._M_local_buf[0] = '\0';
      local_418 = &local_408;
      local_410 = (element_type *)0x0;
      local_408._M_local_buf[0] = '\0';
      local_3f8 = &local_3e8;
      local_3f0 = (pointer)0x0;
      local_3e8._M_local_buf[0] = '\0';
      *(SQLStatement **)(local_398 + 0x10) = (SQLStatement *)0x0;
      *(SQLStatement **)pvVar13 = (SQLStatement *)0x0;
      *(SQLStatement **)(pvVar13 + 8) = (SQLStatement *)0x0;
      ::std::__cxx11::string::_M_assign((string *)&local_418);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_488);
      ::std::__cxx11::string::_M_assign((string *)local_458);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_488);
      ::std::__cxx11::string::_M_assign((string *)&local_438);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_488);
      ::std::__cxx11::string::_M_assign((string *)&local_3f8);
      pvVar13 = local_398;
      local_1e0._0_8_ = local_1e0 + 0x10;
      if (local_458 == (undefined1  [8])&local_448) {
        local_1e0._24_8_ = local_448._8_8_;
      }
      else {
        local_1e0._0_8_ = local_458;
      }
      local_1e0._16_8_ = local_448._M_allocated_capacity;
      local_1e0._8_8_ = pvStack_450;
      pvStack_450 = (vector<duckdb::DummyBinding,_true> *)0x0;
      local_448._M_allocated_capacity = local_448._M_allocated_capacity & 0xffffffffffffff00;
      local_1e0._32_8_ = local_1e0 + 0x30;
      if (local_438 == &local_428) {
        local_1e0._56_8_ = local_428._8_8_;
      }
      else {
        local_1e0._32_8_ = local_438;
      }
      local_1e0._49_7_ = local_428._M_allocated_capacity._1_7_;
      local_1e0[0x30] = local_428._M_local_buf[0];
      local_1e0._40_8_ = local_430;
      local_430 = (pointer)0x0;
      local_428._M_local_buf[0] = '\0';
      local_1e0._64_8_ = local_1e0 + 0x50;
      if (local_418 == &local_408) {
        local_1e0._88_8_ = local_408._8_8_;
      }
      else {
        local_1e0._64_8_ = local_418;
      }
      local_1e0._81_7_ = local_408._M_allocated_capacity._1_7_;
      local_1e0[0x50] = local_408._M_local_buf[0];
      local_1e0._72_8_ = local_410;
      local_410 = (element_type *)0x0;
      local_408._M_local_buf[0] = '\0';
      local_1e0._96_8_ = local_1e0 + 0x70;
      if (local_3f8 == &local_3e8) {
        local_1e0._120_8_ = local_3e8._8_8_;
      }
      else {
        local_1e0._96_8_ = local_3f8;
      }
      local_1e0._113_7_ = local_3e8._M_allocated_capacity._1_7_;
      local_1e0[0x70] = local_3e8._M_local_buf[0];
      local_1e0._104_8_ = local_3f0;
      local_3f0 = (pointer)0x0;
      local_3e8._M_local_buf[0] = '\0';
      local_160.ptr = local_3d8;
      pbStack_158 = pbStack_3d0;
      local_150 = local_3c8;
      *(SQLStatement **)(local_398 + 0x10) = (SQLStatement *)0x0;
      *(SQLStatement **)pvVar13 = (SQLStatement *)0x0;
      *(SQLStatement **)(pvVar13 + 8) = (SQLStatement *)0x0;
      local_458 = (undefined1  [8])&local_448;
      local_438 = &local_428;
      local_418 = &local_408;
      local_3f8 = &local_3e8;
      ExportedTableInfo::ExportedTableInfo
                ((ExportedTableInfo *)local_388,table,(ExportedTableData *)local_1e0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)local_228);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_200._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._96_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x70)) {
        operator_delete((void *)local_1e0._96_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._64_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x50)) {
        operator_delete((void *)local_1e0._64_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._32_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x30)) {
        operator_delete((void *)local_1e0._32_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      pBVar26 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                              *)&local_3c0);
      ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::
      push_back(&(pBVar26->data).
                 super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ,(value_type *)local_388);
      CopyStatement::CopyStatement((CopyStatement *)local_148);
      uVar15.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)local_d0[0];
      local_d0[0].super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           local_488._M_head_impl;
      local_488._M_head_impl = (CopyInfo *)0x0;
      if (uVar15.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
          super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
          super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0)
      {
        (**(code **)(*(long *)uVar15.
                              super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                              .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))()
        ;
      }
      this_01 = (BaseTableRef *)operator_new(0xd0);
      BaseTableRef::BaseTableRef(this_01);
      local_480._M_head_impl = this_01;
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_d0);
      pBVar27 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_480);
      ::std::__cxx11::string::_M_assign((string *)&pBVar27->catalog_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_d0);
      pBVar27 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_480);
      ::std::__cxx11::string::_M_assign((string *)&pBVar27->schema_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_d0);
      pBVar27 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_480);
      ::std::__cxx11::string::_M_assign((string *)&pBVar27->table_name);
      this_02 = (SelectNode *)operator_new(0xf0);
      SelectNode::SelectNode(this_02);
      _Var10._M_head_impl = local_480._M_head_impl;
      local_480._M_head_impl = (BaseTableRef *)0x0;
      local_468._M_head_impl = this_02;
      pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_468);
      _Var6._M_head_impl =
           (pSVar28->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar28->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           &(_Var10._M_head_impl)->super_TableRef;
      if (_Var6._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var6._M_head_impl)->_vptr_TableRef + 8))();
      }
      pbVar14 = pbStack_280;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (args = local_288; args != pbVar14;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&args[1].field_2 + 8)) {
        make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string&>
                  ((duckdb *)local_268,args);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_3b8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_268);
        if (local_268 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_268 + 8))();
        }
      }
      pSVar28 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_468);
      local_258._0_8_ =
           (pSVar28->select_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar28->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_3b8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_268 = (undefined1  [8])
                  (pSVar28->select_list).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pLStack_260 = (pointer)(pSVar28->select_list).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      (pSVar28->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_3b8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pSVar28->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_3b8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)local_268);
      _Var11._M_head_impl = local_468._M_head_impl;
      local_468._M_head_impl = (SelectNode *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_3b8);
      if (local_468._M_head_impl != (SelectNode *)0x0) {
        (*((local_468._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      if (local_480._M_head_impl != (BaseTableRef *)0x0) {
        (*((local_480._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      }
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(local_d0);
      _Var7._M_head_impl =
           (pCVar18->select_statement).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pCVar18->select_statement).
      super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var11._M_head_impl)->super_QueryNode;
      if (_Var7._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var7._M_head_impl)->_vptr_QueryNode + 8))();
      }
      CreateBinder((Binder *)&local_3b8,(local_470.ptr)->context,local_470,REGULAR_BINDER);
      this_03 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&local_3b8);
      Bind((BoundStatement *)local_268,this_03,(CopyStatement *)local_148,EXPORT_DATABASE);
      local_480._M_head_impl = (BaseTableRef *)local_268;
      local_268 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)local_2e8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_480);
      if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )local_480._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                              *)&((local_480._M_head_impl)->super_TableRef)._vptr_TableRef)->
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           )._M_t + 8))();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_258 + 0x10));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&pLStack_260);
      if (local_268 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)local_268)[1])();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_3b8.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_3b8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_148 = (undefined1  [8])local_208.ptr;
      if (local_d0[0].super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>.
          _M_t.super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
          super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0)
      {
        (**(code **)(*(long *)local_d0[0].
                              super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>
                              .super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl + 8))()
        ;
      }
      local_d0[0].super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
           (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
           (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0
      ;
      SQLStatement::~SQLStatement((SQLStatement *)local_148);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_300);
      if (local_350.extension_info.
          super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
          local_310) {
        operator_delete((void *)local_350.extension_info.
                                super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>.
                                _M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350.alias._M_dataplus._M_p != &local_350.alias.field_2) {
        operator_delete(local_350.alias._M_dataplus._M_p);
      }
      if (local_368.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_350
         ) {
        operator_delete(local_368.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
      }
      if ((undefined1 *)local_388._8_8_ != local_378 + 8) {
        operator_delete((void *)local_388._8_8_);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_398);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8);
      }
      if (local_418 != &local_408) {
        operator_delete(local_418);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
      if (local_458 != (undefined1  [8])&local_448) {
        operator_delete((void *)local_458);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_288);
      if (local_488._M_head_impl != (CopyInfo *)0x0) {
        (*((local_488._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      prVar29 = (pointer)(local_1f0._M_allocated_capacity + 8);
    } while (prVar29 != local_1f8);
    local_98 = local_2d8;
    paVar34 = local_2d0;
    local_a8._0_4_ = local_2e8._0_4_;
    local_a8._4_4_ = local_2e8._4_4_;
    local_a8._8_4_ = puStack_2e0._0_4_;
    local_a8._12_4_ = puStack_2e0._4_4_;
  }
  local_2e8 = (undefined1  [8])0x0;
  puStack_2e0 = (pointer)0x0;
  local_2d8 = (pointer)0x0;
  UnionOperators((Binder *)local_388,
                 (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)local_470.ptr);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             *)&local_a8);
  pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_478);
  cVar17 = (*(code *)(local_390._M_nxt)->_M_nxt[0xd]._M_nxt)(local_390._M_nxt,&pCVar18->file_path,0)
  ;
  if (cVar17 == '\0') {
    pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_478);
    (*(code *)(local_390._M_nxt)->_M_nxt[0xe]._M_nxt)(local_390._M_nxt,&pCVar18->file_path,0);
  }
  pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_478);
  ::std::__cxx11::string::_M_assign((string *)&pCVar18->catalog);
  make_uniq<duckdb::LogicalExport,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>,duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
            ((duckdb *)local_458,(CopyFunction *)(paVar34->_M_local_buf + 0x120),local_478,
             (unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
              *)&local_3c0);
  if ((catalog_entry_vector_t *)local_388._0_8_ != (catalog_entry_vector_t *)0x0) {
    pLVar30 = unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>::
              operator->((unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>
                          *)local_458);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar30->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_388);
  }
  auVar12 = local_458;
  local_458 = (undefined1  [8])0x0;
  _Var8.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (local_460->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (local_460->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)auVar12;
  if (_Var8.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var8.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  pSVar31 = GetStatementProperties(local_470.ptr);
  pSVar31->allow_stream_result = false;
  pSVar31->return_type = NOTHING;
  if (local_458 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_458 + 8))();
  }
  if ((catalog_entry_vector_t *)local_388._0_8_ != (catalog_entry_vector_t *)0x0) {
    (**(code **)(*(long *)local_388._0_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             *)local_2e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  if (local_3c0._M_head_impl != (BoundExportData *)0x0) {
    (*((local_3c0._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  if ((ClientContext *)
      local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (ClientContext *)0x0) {
    operator_delete(local_c0.
                    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c8.
      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.
                    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  return local_460;
}

Assistant:

BoundStatement Binder::Bind(ExportStatement &stmt) {
	// COPY TO a file
	BoundStatement result;
	result.types = {LogicalType::BOOLEAN};
	result.names = {"Success"};

	// lookup the format in the catalog
	auto &copy_function =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, stmt.info->format);
	if (!copy_function.function.copy_to_bind && !copy_function.function.plan) {
		throw NotImplementedException("COPY TO is not supported for FORMAT \"%s\"", stmt.info->format);
	}

	// gather a list of all the tables
	string catalog = stmt.database.empty() ? INVALID_CATALOG : stmt.database;
	catalog_entry_vector_t tables;
	auto schemas = Catalog::GetSchemas(context, catalog);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				tables.push_back(entry.Cast<TableCatalogEntry>());
			}
		});
	}

	// reorder tables because of foreign key constraint
	ReorderTableEntries(tables);

	// now generate the COPY statements for each of the tables
	auto &fs = FileSystem::GetFileSystem(context);

	auto exported_tables = make_uniq<BoundExportData>();

	unordered_set<string> table_name_index;
	vector<unique_ptr<LogicalOperator>> export_nodes;
	for (auto &t : tables) {
		auto &table = t.get().Cast<TableCatalogEntry>();
		auto info = make_uniq<CopyInfo>();
		// we copy the options supplied to the EXPORT
		info->format = stmt.info->format;
		info->options = stmt.info->options;
		// set up the file name for the COPY TO

		idx_t id = 0;
		while (true) {
			string id_suffix = id == 0 ? string() : "_" + to_string(id);
			auto name = CreateFileName(id_suffix, table, copy_function.function.extension);
			auto directory = stmt.info->file_path;
			auto full_path = fs.JoinPath(directory, name);
			info->file_path = full_path;
			auto insert_result = table_name_index.insert(info->file_path);
			if (insert_result.second) {
				// this name was not yet taken: take it
				break;
			}
			id++;
		}
		info->is_from = false;
		info->catalog = catalog;
		info->schema = table.schema.name;
		info->table = table.name;

		// We can not export generated columns
		child_list_t<LogicalType> select_list;
		// Let's verify if any on these columns have not null constraints
		vector<string> not_null_columns;
		for (auto &constaint : table.GetConstraints()) {
			if (constaint->type == ConstraintType::NOT_NULL) {
				auto &not_null_constraint = constaint->Cast<NotNullConstraint>();
				not_null_columns.push_back(table.GetColumn(not_null_constraint.index).GetName());
			}
		}
		for (auto &col : table.GetColumns().Physical()) {
			select_list.push_back(std::make_pair(col.Name(), col.Type()));
		}

		ExportedTableData exported_data;
		exported_data.database_name = catalog;
		exported_data.table_name = info->table;
		exported_data.schema_name = info->schema;

		exported_data.file_path = info->file_path;

		ExportedTableInfo table_info(table, std::move(exported_data), not_null_columns);
		exported_tables->data.push_back(table_info);
		id++;

		// generate the copy statement and bind it
		CopyStatement copy_stmt;
		copy_stmt.info = std::move(info);
		copy_stmt.info->select_statement = CreateSelectStatement(copy_stmt, select_list);

		auto copy_binder = Binder::CreateBinder(context, this);
		auto bound_statement = copy_binder->Bind(copy_stmt, CopyToType::EXPORT_DATABASE);

		auto plan = std::move(bound_statement.plan);

		export_nodes.push_back(std::move(plan));
	}
	auto child_operator = UnionOperators(std::move(export_nodes));

	// try to create the directory, if it doesn't exist yet
	// a bit hacky to do it here, but we need to create the directory BEFORE the copy statements run
	if (!fs.DirectoryExists(stmt.info->file_path)) {
		fs.CreateDirectory(stmt.info->file_path);
	}

	stmt.info->catalog = catalog;
	// create the export node
	auto export_node =
	    make_uniq<LogicalExport>(copy_function.function, std::move(stmt.info), std::move(exported_tables));

	if (child_operator) {
		export_node->children.push_back(std::move(child_operator));
	}

	result.plan = std::move(export_node);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}